

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  byte bVar1;
  long lVar2;
  size_t sVar3;
  U16 UVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  BYTE *dstEnd;
  BYTE *pBVar7;
  bool bVar8;
  bool local_181;
  int maxDecompressedSize_local;
  int compressedSize_local;
  char *dest_local;
  char *source_local;
  size_t dec64;
  BYTE *copyFrom;
  BYTE *endOfMatch;
  size_t copySize;
  uint s_1;
  uint s;
  BYTE *match;
  size_t length;
  uint token;
  int checkOffset;
  int safeDecode;
  size_t dec64table [8];
  size_t dec32table [8];
  BYTE *dictEnd;
  BYTE *lowLimit;
  BYTE *oexit;
  BYTE *cpy;
  BYTE *oend;
  BYTE *op;
  BYTE *iend;
  BYTE *ip;
  int local_c;
  
  pBVar5 = (BYTE *)(source + compressedSize);
  pBVar6 = (BYTE *)(dest + maxDecompressedSize);
  memcpy(dec64table + 7,&DAT_0026d0e0,0x40);
  memset(&checkOffset,0,0x40);
  dec64table[2] = 0xffffffffffffffff;
  dec64table[4] = 1;
  dec64table[5] = 2;
  dec64table[6] = 3;
  pBVar7 = (BYTE *)dest;
  iend = (BYTE *)source;
  if (maxDecompressedSize == 0) {
    bVar8 = false;
    if (compressedSize == 1) {
      bVar8 = *source == '\0';
    }
    local_c = -1;
    if (bVar8) {
      local_c = 0;
    }
  }
  else {
    while( true ) {
      oend = pBVar7;
      pBVar7 = iend + 1;
      bVar1 = *iend;
      match = (BYTE *)(ulong)(bVar1 >> 4);
      iend = pBVar7;
      if (match == (BYTE *)0xf) {
        match = (BYTE *)0xf;
        do {
          pBVar7 = iend + 1;
          match = match + (uint)*iend;
          local_181 = pBVar7 < pBVar5 + -0xf && *iend == 0xff;
          iend = pBVar7;
        } while (local_181);
        if ((oend + (long)match < oend) || (pBVar7 + (long)match < pBVar7)) goto LAB_0025df44;
      }
      dstEnd = oend + (long)match;
      if ((pBVar6 + -0xc < dstEnd) || (pBVar5 + -8 < iend + (long)match)) break;
      LZ4_wildCopy(oend,iend,dstEnd);
      UVar4 = LZ4_readLE16(match + (long)iend);
      _s_1 = dstEnd + -(long)(int)(uint)UVar4;
      iend = match + (long)iend + 2;
      if (_s_1 < dest) goto LAB_0025df44;
      match = (BYTE *)(ulong)(bVar1 & 0xf);
      if (match == (BYTE *)0xf) {
        match = (BYTE *)0xf;
        do {
          if (pBVar5 + -5 < iend) goto LAB_0025df44;
          pBVar7 = iend + 1;
          bVar1 = *iend;
          match = match + (uint)bVar1;
          iend = pBVar7;
        } while (bVar1 == 0xff);
        if (dstEnd + (long)match < dstEnd) goto LAB_0025df44;
      }
      pBVar7 = dstEnd + (long)(match + 4);
      if ((long)dstEnd - (long)_s_1 < 8) {
        lVar2 = *(long *)(&checkOffset + ((long)dstEnd - (long)_s_1) * 2);
        *dstEnd = *_s_1;
        dstEnd[1] = _s_1[1];
        dstEnd[2] = _s_1[2];
        dstEnd[3] = _s_1[3];
        sVar3 = dec64table[(long)(dstEnd + (7 - (long)_s_1))];
        LZ4_copy4(dstEnd + 4,_s_1 + sVar3);
        _s_1 = _s_1 + sVar3 + -lVar2;
      }
      else {
        LZ4_copy8(dstEnd,_s_1);
        _s_1 = _s_1 + 8;
      }
      oend = dstEnd + 8;
      if (pBVar6 + -0xc < pBVar7) {
        if (pBVar6 + -5 < pBVar7) goto LAB_0025df44;
        if (oend < pBVar6 + -8) {
          LZ4_wildCopy(oend,_s_1,pBVar6 + -8);
          _s_1 = _s_1 + (long)(pBVar6 + (-8 - (long)oend));
          oend = pBVar6 + -8;
        }
        while (oend < pBVar7) {
          *oend = *_s_1;
          _s_1 = _s_1 + 1;
          oend = oend + 1;
        }
      }
      else {
        LZ4_wildCopy(oend,_s_1,pBVar7);
      }
    }
    if ((iend + (long)match == pBVar5) && (dstEnd <= pBVar6)) {
      memcpy(oend,iend,(size_t)match);
      return ((int)match + (int)oend) - (int)dest;
    }
LAB_0025df44:
    local_c = -1 - ((int)iend - (int)source);
  }
  return local_c;
}

Assistant:

int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize, endOnInputSize, full, 0, noDict, (BYTE*)dest, NULL, 0);
}